

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

void __thiscall
CRollingBloomFilter::insert(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Span<const_unsigned_char> vDataToHash;
  byte bVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  int *in_RDI;
  long in_FS_OFFSET;
  uint32_t pos;
  int bit;
  uint32_t h;
  int n;
  uint64_t mask;
  uint64_t p2;
  uint64_t p1;
  uint32_t p;
  uint64_t nGenerationMask2;
  uint64_t nGenerationMask1;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  ulong in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff78;
  int local_64;
  uint local_44;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[1] == *in_RDI) {
    in_RDI[1] = 0;
    in_RDI[2] = in_RDI[2] + 1;
    if (in_RDI[2] == 4) {
      in_RDI[2] = 1;
    }
    uVar1 = in_RDI[2];
    iVar2 = in_RDI[2];
    for (local_44 = 0;
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
        local_44 < sVar7; local_44 = local_44 + 2) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      uVar4 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      uVar5 = *pvVar8;
      uVar9 = uVar4 ^ -(long)(int)(uVar1 & 1) | uVar5 ^ -(long)(iVar2 >> 1);
      in_stack_ffffffffffffff70 = (uchar *)(uVar4 & uVar9);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      *pvVar8 = (value_type)in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff78 = uVar5 & uVar9;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      *pvVar8 = in_stack_ffffffffffffff78;
    }
  }
  in_RDI[1] = in_RDI[1] + 1;
  for (local_64 = 0; local_64 < in_RDI[0xb]; local_64 = local_64 + 1) {
    vDataToHash.m_size = in_stack_ffffffffffffff78;
    vDataToHash.m_data = in_stack_ffffffffffffff70;
    in_stack_ffffffffffffff5c =
         RollingBloomHash(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,vDataToHash);
    bVar6 = (byte)in_stack_ffffffffffffff5c;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    FastRange32(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff60 =
         *pvVar8 & (1L << (bVar6 & 0x3f) ^ 0xffffffffffffffffU) |
         (long)(int)(in_RDI[2] & 1) << (bVar6 & 0x3f);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    *pvVar8 = in_stack_ffffffffffffff60;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff68 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         (*pvVar8 & (1L << (bVar6 & 0x3f) ^ 0xffffffffffffffffU) |
         (long)(in_RDI[2] >> 1) << (bVar6 & 0x3f));
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    *pvVar8 = (value_type)in_stack_ffffffffffffff68;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CRollingBloomFilter::insert(Span<const unsigned char> vKey)
{
    if (nEntriesThisGeneration == nEntriesPerGeneration) {
        nEntriesThisGeneration = 0;
        nGeneration++;
        if (nGeneration == 4) {
            nGeneration = 1;
        }
        uint64_t nGenerationMask1 = 0 - (uint64_t)(nGeneration & 1);
        uint64_t nGenerationMask2 = 0 - (uint64_t)(nGeneration >> 1);
        /* Wipe old entries that used this generation number. */
        for (uint32_t p = 0; p < data.size(); p += 2) {
            uint64_t p1 = data[p], p2 = data[p + 1];
            uint64_t mask = (p1 ^ nGenerationMask1) | (p2 ^ nGenerationMask2);
            data[p] = p1 & mask;
            data[p + 1] = p2 & mask;
        }
    }
    nEntriesThisGeneration++;

    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        /* FastMod works with the upper bits of h, so it is safe to ignore that the lower bits of h are already used for bit. */
        uint32_t pos = FastRange32(h, data.size());
        /* The lowest bit of pos is ignored, and set to zero for the first bit, and to one for the second. */
        data[pos & ~1U] = (data[pos & ~1U] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration & 1)) << bit;
        data[pos | 1] = (data[pos | 1] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration >> 1)) << bit;
    }
}